

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  pointer ppVar2;
  bool bVar3;
  pair<const_int,_int> pVar4;
  int i;
  int index;
  uint index_00;
  char *in_R9;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  TypeParam ht3;
  hasher hasher;
  TypeParam ht1;
  TypeParam ht2;
  pair<const_int,_int> local_218;
  undefined8 *local_210;
  AssertHelper local_208;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_200;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_1f8;
  allocator_type local_1d0;
  undefined1 local_1c0 [8];
  int *local_1b8;
  char local_1b0 [104];
  pointer local_148;
  hasher local_13c;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_130;
  undefined1 local_b0 [8];
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_a8;
  
  local_1c0 = (undefined1  [8])0x0;
  local_1b8 = (int *)((ulong)local_1b8 & 0xffffffff00000000);
  local_1f8.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_1f8.first.super_iterator.pos =
       (pointer)((ulong)local_1f8.first.super_iterator.pos & 0xffffffff00000000);
  local_b0 = (undefined1  [8])((ulong)local_b0 & 0xffffffff00000000);
  local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher._0_8_ =
       (int *)0x0;
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_130,0,(hasher *)local_1c0,(key_equal *)&local_1f8,(allocator_type *)local_b0)
  ;
  local_1f8.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_1f8.first.super_iterator.pos =
       (pointer)((ulong)local_1f8.first.super_iterator.pos & 0xffffffff00000000);
  local_1d0._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_1d0.count_ = (int *)((ulong)local_1d0.count_._4_4_ << 0x20);
  local_1c0 = (undefined1  [8])((ulong)local_1c0 & 0xffffffff00000000);
  local_1b8 = (int *)0x0;
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_b0,0,(hasher *)&local_1f8,(key_equal *)&local_1d0,(allocator_type *)local_1c0)
  ;
  this_00 = &local_130.ht_;
  bVar3 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_1f8.first.super_iterator.pos = (pointer)0x0;
  local_1f8.first.super_iterator.ht._0_1_ = bVar3;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c0,(internal *)&local_1f8,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42e,(char *)local_1c0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if (local_1c0 != (undefined1  [8])local_1b0) {
      operator_delete((void *)local_1c0);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1d0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._0_8_ + 8))();
    }
    ppVar2 = local_1f8.first.super_iterator.pos;
    if (local_1f8.first.super_iterator.pos != (pointer)0x0) {
      if (*local_1f8.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_1f8.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_1f8.first.super_iterator.pos);
      }
      operator_delete(ppVar2);
    }
  }
  local_1f8.first.super_iterator.ht._0_1_ =
       google::
       dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::operator==(&this_00->rep,&local_a8);
  local_1f8.first.super_iterator.pos = (pointer)0x0;
  if (!(bool)local_1f8.first.super_iterator.ht._0_1_) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c0,(internal *)&local_1f8,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42f,(char *)local_1c0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if (local_1c0 != (undefined1  [8])local_1b0) {
      operator_delete((void *)local_1c0);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._0_8_ + 8))();
    }
    ppVar2 = local_1f8.first.super_iterator.pos;
    if (local_1f8.first.super_iterator.pos != (pointer)0x0) {
      if (*local_1f8.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_1f8.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_1f8.first.super_iterator.pos);
      }
      operator_delete(ppVar2);
    }
  }
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  local_130.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_130.ht_.rep.key_info.delkey = pVar4.first;
  local_1f8.first.super_iterator.ht._0_1_ =
       google::
       dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::operator==(&this_00->rep,&local_a8);
  local_1f8.first.super_iterator.pos = (pointer)0x0;
  if (!(bool)local_1f8.first.super_iterator.ht._0_1_) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c0,(internal *)&local_1f8,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x432,(char *)local_1c0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if (local_1c0 != (undefined1  [8])local_1b0) {
      operator_delete((void *)local_1c0);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._0_8_ + 8))();
    }
    ppVar2 = local_1f8.first.super_iterator.pos;
    if (local_1f8.first.super_iterator.pos != (pointer)0x0) {
      if (*local_1f8.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_1f8.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_1f8.first.super_iterator.pos);
      }
      operator_delete(ppVar2);
    }
  }
  local_1f8.first.super_iterator.ht._0_1_ =
       google::
       dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::operator==(&this_00->rep,&local_a8);
  local_1f8.first.super_iterator.pos = (pointer)0x0;
  if (!(bool)local_1f8.first.super_iterator.ht._0_1_) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c0,(internal *)&local_1f8,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x433,(char *)local_1c0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if (local_1c0 != (undefined1  [8])local_1b0) {
      operator_delete((void *)local_1c0);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._0_8_ + 8))();
    }
    ppVar2 = local_1f8.first.super_iterator.pos;
    if (local_1f8.first.super_iterator.pos != (pointer)0x0) {
      if (*local_1f8.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_1f8.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_1f8.first.super_iterator.pos);
      }
      operator_delete(ppVar2);
    }
  }
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize(&this_00->rep,2000);
  bVar3 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_1f8.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_1f8.first.super_iterator.ht._1_7_,bVar3);
  local_1f8.first.super_iterator.pos = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c0,(internal *)&local_1f8,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x435,(char *)local_1c0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if (local_1c0 != (undefined1  [8])local_1b0) {
      operator_delete((void *)local_1c0);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._0_8_ + 8))();
    }
    ppVar2 = local_1f8.first.super_iterator.pos;
    if (local_1f8.first.super_iterator.pos != (pointer)0x0) {
      if (*local_1f8.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_1f8.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_1f8.first.super_iterator.pos);
      }
      operator_delete(ppVar2);
    }
  }
  local_13c.id_ = 1;
  local_13c.num_hashes_ = 0;
  local_13c.num_compares_ = 0;
  local_1d0.id_ = 2;
  local_1d0.count_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_1c0,5,&local_13c,&local_13c,&local_1d0);
  bVar3 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,
                       (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)&local_1b8);
  local_210 = (undefined8 *)0x0;
  local_218.first._0_1_ = bVar3;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1f8,(internal *)&local_218,(AssertionResult *)"ht1 == ht3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43b,(char *)local_1f8.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if (local_1f8.first.super_iterator.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_1f8.first.super_iterator + 0x10U)) {
      operator_delete(local_1f8.first.super_iterator.ht);
    }
    if (local_200._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_200._M_head_impl + 8))();
    }
    puVar1 = local_210;
    if (local_210 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_210 != local_210 + 2) {
        operator_delete((undefined8 *)*local_210);
      }
      operator_delete(puVar1);
    }
  }
  local_218.first._0_1_ =
       google::
       dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::operator==(&this_00->rep,
                    (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)&local_1b8);
  local_210 = (undefined8 *)0x0;
  if (!(bool)(undefined1)local_218.first) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1f8,(internal *)&local_218,(AssertionResult *)"ht1 != ht3","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43c,(char *)local_1f8.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if (local_1f8.first.super_iterator.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_1f8.first.super_iterator + 0x10U)) {
      operator_delete(local_1f8.first.super_iterator.ht);
    }
    if (local_200._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_200._M_head_impl + 8))();
    }
    puVar1 = local_210;
    if (local_210 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_210 != local_210 + 2) {
        operator_delete((undefined8 *)*local_210);
      }
      operator_delete(puVar1);
    }
  }
  local_218 = UniqueObjectHelper<std::pair<int_const,int>>(2);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&local_1f8,&local_130,&local_218);
  bVar3 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_210 = (undefined8 *)0x0;
  local_218.first._0_1_ = !bVar3;
  if (bVar3) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1f8,(internal *)&local_218,(AssertionResult *)"ht1 != ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43f,(char *)local_1f8.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if (local_1f8.first.super_iterator.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_1f8.first.super_iterator + 0x10U)) {
      operator_delete(local_1f8.first.super_iterator.ht);
    }
    if (local_200._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_200._M_head_impl + 8))();
    }
    puVar1 = local_210;
    if (local_210 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_210 != local_210 + 2) {
        operator_delete((undefined8 *)*local_210);
      }
      operator_delete(puVar1);
    }
  }
  bVar3 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_218.first._0_1_ = !bVar3;
  local_210 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1f8,(internal *)&local_218,(AssertionResult *)"ht1 == ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x440,(char *)local_1f8.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if (local_1f8.first.super_iterator.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_1f8.first.super_iterator + 0x10U)) {
      operator_delete(local_1f8.first.super_iterator.ht);
    }
    if (local_200._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_200._M_head_impl + 8))();
    }
    puVar1 = local_210;
    if (local_210 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_210 != local_210 + 2) {
        operator_delete((undefined8 *)*local_210);
      }
      operator_delete(puVar1);
    }
  }
  local_218 = UniqueObjectHelper<std::pair<int_const,int>>(2);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&local_1f8,
           (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)local_b0,&local_218);
  bVar3 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_218.first._0_1_ = bVar3;
  local_210 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1f8,(internal *)&local_218,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x443,(char *)local_1f8.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if (local_1f8.first.super_iterator.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_1f8.first.super_iterator + 0x10U)) {
      operator_delete(local_1f8.first.super_iterator.ht);
    }
    if (local_200._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_200._M_head_impl + 8))();
    }
    puVar1 = local_210;
    if (local_210 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_210 != local_210 + 2) {
        operator_delete((undefined8 *)*local_210);
      }
      operator_delete(puVar1);
    }
  }
  index = 3;
  do {
    local_218 = UniqueObjectHelper<std::pair<int_const,int>>(index);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_1f8,&local_130,&local_218);
    index = index + 1;
  } while (index != 0x7d1);
  index_00 = 0x7d1;
  do {
    index_00 = index_00 - 1;
    local_218 = UniqueObjectHelper<std::pair<int_const,int>>(index_00);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_1f8,
             (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_b0,&local_218);
  } while (3 < index_00);
  bVar3 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_218.first._0_1_ = bVar3;
  local_210 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1f8,(internal *)&local_218,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,1099,(char *)local_1f8.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if (local_1f8.first.super_iterator.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_1f8.first.super_iterator + 0x10U)) {
      operator_delete(local_1f8.first.super_iterator.ht);
    }
    if (local_200._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_200._M_head_impl + 8))();
    }
    puVar1 = local_210;
    if (local_210 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_210 != local_210 + 2) {
        operator_delete((undefined8 *)*local_210);
      }
      operator_delete(puVar1);
    }
  }
  local_1c0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c16428;
  if (local_148 != (pointer)0x0) {
    free(local_148);
  }
  local_b0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c16428;
  if (local_a8.table != (pointer)0x0) {
    free(local_a8.table);
  }
  local_130._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c16428;
  if (local_130.ht_.rep.table != (pointer)0x0) {
    free(local_130.ht_.rep.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}